

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
SolidGlassMaterial::sample
          (SolidGlassMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,
          bool emit)

{
  mt19937 *g;
  undefined8 uVar1;
  Texture *this_00;
  Ray *this_01;
  Vector3f *v;
  Vector3f *pVVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  float fVar9;
  Vector3f np;
  undefined1 local_ac [32];
  undefined1 local_8c [16];
  Ray local_7c;
  Vector3f local_60;
  Vector2f local_54;
  Vector2f local_4c;
  Vector2f local_44 [2];
  undefined1 extraout_var [60];
  
  g = rt->g;
  v = &ray->d;
  local_ac._20_8_ = coe;
  operator-(v);
  pVVar2 = &hit->norm;
  auVar8._0_4_ = Vector3f::dot(&local_7c.o,pVVar2);
  auVar8._4_60_ = extraout_var;
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar6 = auVar8._0_16_;
  auVar3 = vxorps_avx512vl(auVar6,auVar3);
  local_ac._12_8_ = pVVar2;
  if (auVar8._0_4_ <= auVar3._0_4_) {
    auVar3 = vfmadd213ss_fma(auVar6,auVar3,SUB6416(ZEXT464(0x3f800000),0));
    auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,auVar3);
    auVar3 = vsqrtss_avx(auVar3,auVar3);
    fVar5 = auVar3._0_4_;
    fVar9 = fVar5 / this->refractCoef;
    if (fVar9 <= 1.0) {
      local_8c._0_4_ = asinf(fVar5);
      fVar9 = asinf(fVar9);
      Ray::Ray(&local_7c);
      Ray::pos((Ray *)local_ac,hit->t);
      Vector3f::operator=(&local_7c.o,(Vector3f *)local_ac);
      pVVar2 = (Vector3f *)local_ac._12_8_;
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        fVar9 = (float)local_8c._0_4_ - fVar9;
        Vector3f::normalized((Vector3f *)local_ac._12_8_);
        fVar9 = sinf(fVar9);
        ::operator*(&local_60,fVar9 / fVar5);
        operator+(v,&local_60);
        Vector3f::normalized((Vector3f *)(local_8c + 4));
        Vector3f::operator=(&local_7c.d,(Vector3f *)local_ac);
      }
      else {
        Vector3f::operator=(&local_7c.d,v);
        pVVar2 = (Vector3f *)local_ac._12_8_;
      }
      fVar5 = Vector3f::dot(pVVar2,&local_7c.d);
      fVar5 = 1.0 - fVar5;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * fVar5 * fVar5 * fVar5 * (1.0 - this->r0))),
                               ZEXT416((uint)fVar5),ZEXT416((uint)this->r0));
      auVar6._0_8_ = (double)auVar3._0_4_;
      auVar6._8_8_ = auVar3._8_8_;
      auVar3 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar6,ZEXT816(0x3fd0000000000000));
      fVar5 = randf(g);
      if ((float)auVar3._0_8_ < fVar5) {
        Ray::operator=(ray,&local_7c);
        Vector2f::Vector2f(&local_4c,&hit->pos);
        this_00 = (Texture *)(local_8c + 4);
        Texture::get(this_00,(Vector2f *)&this->refractColor);
        this_01 = (Ray *)local_ac;
        goto LAB_001d4ee9;
      }
    }
  }
  else {
    auVar3 = vfmadd213ss_fma(auVar6,auVar3,SUB6416(ZEXT464(0x3f800000),0));
    auVar3 = vmaxss_avx(ZEXT816(0) << 0x20,auVar3);
    auVar3 = vsqrtss_avx(auVar3,auVar3);
    fVar9 = auVar3._0_4_;
    fVar5 = fVar9 * this->refractCoef;
    if (fVar5 <= 1.0) {
      fVar4 = 1.0 - auVar8._0_4_;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar4 * fVar4 * fVar4 * fVar4 * (1.0 - this->r0))),
                               ZEXT416((uint)fVar4),ZEXT416((uint)this->r0));
      auVar7._0_8_ = (double)auVar3._0_4_;
      auVar7._8_8_ = auVar3._8_8_;
      auVar3 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar7,ZEXT816(0x3fd0000000000000));
      fVar4 = randf(g);
      if ((float)auVar3._0_8_ < fVar4) {
        fVar4 = asinf(fVar9);
        fVar5 = asinf(fVar5);
        Ray::pos(&local_7c,hit->t);
        Vector3f::operator=(&ray->o,&local_7c.o);
        if ((fVar9 != 0.0) || (NAN(fVar9))) {
          Vector3f::normalized((Vector3f *)local_ac._12_8_);
          fVar5 = sinf(fVar4 - fVar5);
          ::operator*((Vector3f *)(local_8c + 4),fVar5 / fVar9);
          operator-(v,(Vector3f *)(local_8c + 4));
          Vector3f::normalized((Vector3f *)local_ac);
          Vector3f::operator=(v,&local_7c.o);
        }
        Vector2f::Vector2f(local_44,&hit->pos);
        this_00 = (Texture *)local_ac;
        Texture::get(this_00,(Vector2f *)&this->refractColor);
        this_01 = &local_7c;
LAB_001d4ee9:
        v = (Vector3f *)local_ac._20_8_;
        ::operator*((Vector3f *)local_ac._20_8_,(Vector3f *)this_00);
        goto LAB_001d4f02;
      }
    }
  }
  Vector2f::Vector2f(&local_54,&hit->pos);
  uVar1 = local_ac._20_8_;
  Texture::get((Texture *)local_ac,(Vector2f *)&this->reflectColor);
  ::operator*((Vector3f *)uVar1,(Vector3f *)local_ac);
  Vector3f::operator=((Vector3f *)uVar1,&local_7c.o);
  uVar1 = local_ac._12_8_;
  ::operator*((Vector3f *)(local_8c + 4),2.0);
  operator-(v);
  fVar5 = Vector3f::dot((Vector3f *)uVar1,&local_60);
  ::operator*((Vector3f *)local_ac,fVar5);
  this_01 = &local_7c;
  operator+((Vector3f *)local_ac,v);
  Vector3f::normalize(&this_01->o);
  Ray::pos((Ray *)local_ac,hit->t);
  Vector3f::operator=(&ray->o,(Vector3f *)local_ac);
LAB_001d4f02:
  Vector3f::operator=(v,&this_01->o);
  return true;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override {
		using std::cerr;
		RNG_TYPE& g = *rt.g;
		float co = Vector3f::dot(-ray.d, hit.norm);
//		std::cerr << co << "sample!"<<" "<<hit.norm[0]<<"w"<<hit.norm[1]<<"w"<<hit.norm[2]<<" "<<ray.d[0]<<"w"<<ray.d[1]<<"w"<<ray.d[2]<<"\n";
		if (co > 0) { //air->glass
			float si = sqrtf(std::max(1 - co * co, float(0)));
			float si2 = si * refractCoef;
//			cerr << "check A " << si2 << "\n";
			if (si2 <= 1) { //total reflection otherwise
				float u = 1 - co;
				float r = r0 + (1 - r0) * u * u * u * u * u;
				r = 0.25 + 0.5 * r;
//				cerr << "prob=" << r << "  " << r0 << "\n";
				if (randf(g) > r) //refract
				{
					//get refraction ray as a linear combination
					float beta = asinf(si), alpha = asinf(si2);
					//					std::cerr << "refract A " << si << "->" << si2 << "  "<<beta<<"->"<<alpha<<"\n";
					float s = beta - alpha;
					ray.o = ray.pos(hit.t);
					//					ray.d = -((-ray.d) * s + hit.norm).normalized();
					if (si != 0) //unchanged otherwise
						ray.d = (ray.d - hit.norm.normalized() * (sinf(s) / si)).normalized();
					coe = coe * refractColor.get(hit.pos);
					return 1;
				}
			}
		}
		else { //glass->air
			co = -co;
			float si = sqrtf(std::max(1 - co * co,float(0)));
			float si2 = si / refractCoef;
//			cerr << "check B " << si2 << " "<<ray.d[0]<<"w"<<ray.d[1]<<"w"<<ray.d[2]<<" "<<hit.t<<"\n";
//			std::cerr << si << "w" << si2 << "  "<< 1 - co * co <<"?\n";
			if (si2 <= 1) { //total reflection otherwise
					//get refraction ray as a linear combination
				float beta = asinf(si), alpha = asinf(si2);
				//					std::cerr << "refract B " << si << "->" << si2 << "  " << beta << "->" << alpha << "\n";
				float s = beta - alpha;
				Ray ray2;
				ray2.o = ray.pos(hit.t);
				if (si != 0) //unchanged otherwise
					ray2.d = (ray.d + hit.norm.normalized() * (sinf(s) / si)).normalized();
				else ray2.d = ray.d;
				float u = 1 - Vector3f::dot(hit.norm, ray2.d);
//				std::cerr << u << "?\n";
				float r = r0 + (1 - r0) * u * u * u * u * u;
				r = 0.25 + 0.5 * r;
//				cerr << "prob=" << r << "  "<<r0<<"\n";
				if (randf(g) > r) //refract
				{
//					std::cerr << "cool refract!\n";
					ray = ray2;
					coe = coe * refractColor.get(hit.pos);
					return 1;
				}
			}
		}
//		std::cerr << "reflect :(\n";
		//reflect
		coe = coe * reflectColor.get(hit.pos);
		Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
		ray.o = ray.pos(hit.t); ray.d = np; return 1;
		/*
		float co = Vector3f::dot(-ray.d, hit.norm);
		bool in = co > 0; if (!in) co = -co;
		float c = in ? (1 / refractCoef) : refractCoef;
		float cos2t = 1 - c * c * (1 - co * co);
		if (cos2t < 0) //internal
		{
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np; return 1;
		}
		Vector3f rp;
		float c = 1 - (in ? co : Vector3f::dot(rp, hit.norm));
		float p = r0 + (1 - r0) * c * c * c * c * c;
		if (randf(g) < p) { //reflect
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np; return 1;
		}
		else { //refract
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np; return 1;
		}
		bool into = n.dot(nl) > 0;                // Ray from outside going in? 
		double nc = 1, nt = 1.5, nnt = into ? nc / nt : nt / nc, ddn = r.d.dot(nl), cos2t;
		if ((cos2t = 1 - nnt * nnt * (1 - ddn * ddn)) < 0)    // Total internal reflection 
			return obj.e + f.mult(radiance(reflRay, depth, Xi));
		Vec tdir = (r.d * nnt - n * ((into ? 1 : -1) * (ddn * nnt + sqrt(cos2t)))).norm();
		double a = nt - nc, b = nt + nc, R0 = a * a / (b * b), c = 1 - (into ? -ddn : tdir.dot(n));
		double Re = R0 + (1 - R0) * c * c * c * c * c, Tr = 1 - Re, P = .25 + .5 * Re, RP = Re / P, TP = Tr / (1 - P);
		return obj.e + f.mult(depth > 2 ? (erand48(Xi) < P ?   // Russian roulette 
			radiance(reflRay, depth, Xi) * RP : radiance(Ray(x, tdir), depth, Xi) * TP) :
			radiance(reflRay, depth, Xi) * Re + radiance(Ray(x, tdir), depth, Xi) * Tr);*/
	}